

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> * __thiscall
nonius::execution_plan::operator_cast_to_execution_plan
          (execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this)

{
  undefined4 *in_RSI;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *in_RDI;
  parameters *in_stack_ffffffffffffff68;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *__d;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar1;
  int in_stack_ffffffffffffff94;
  benchmark_function *in_stack_ffffffffffffff98;
  parameters *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *in_stack_ffffffffffffffb0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffb8;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffc0;
  
  uVar1 = *in_RSI;
  __d = in_RDI;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
             (duration<double,_std::ratio<1L,_1000000000L>_> *)in_RDI);
  parameters::parameters((parameters *)in_RDI,in_stack_ffffffffffffff68);
  nonius::detail::benchmark_function::benchmark_function
            ((benchmark_function *)in_RDI,(benchmark_function *)in_stack_ffffffffffffff68);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
             (duration<double,_std::ratio<1L,_1000000000L>_> *)__d);
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::execution_plan
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffff94);
  nonius::detail::benchmark_function::~benchmark_function((benchmark_function *)0x218e51);
  parameters::~parameters((parameters *)0x218e5b);
  return __d;
}

Assistant:

operator execution_plan<Duration2>() const {
            return execution_plan<Duration2>{ iterations_per_sample, estimated_duration, params, benchmark, warmup_time, warmup_iterations };
        }